

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O2

void Qiniu_Rio_BlkputRet_Assign(Qiniu_Rio_BlkputRet *self,Qiniu_Rio_BlkputRet *ret)

{
  char *pcVar1;
  char *pcVar2;
  char *__s;
  Qiniu_Uint64 QVar3;
  Qiniu_Bool QVar4;
  undefined4 uVar5;
  Qiniu_Uint32 QVar6;
  Qiniu_Uint32 QVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  
  Qiniu_Rio_BlkputRet_Cleanup(self);
  pcVar1 = ret->ctx;
  pcVar2 = ret->checksum;
  QVar6 = ret->crc32;
  QVar7 = ret->offset;
  QVar3 = ret->expiredAt;
  QVar4 = ret->economical;
  uVar5 = *(undefined4 *)&ret->field_0x2c;
  self->host = ret->host;
  self->economical = QVar4;
  *(undefined4 *)&self->field_0x2c = uVar5;
  self->crc32 = QVar6;
  self->offset = QVar7;
  self->expiredAt = QVar3;
  self->ctx = pcVar1;
  self->checksum = pcVar2;
  pcVar1 = ret->ctx;
  if (pcVar1 != (char *)0x0) {
    sVar8 = strlen(pcVar1);
    sVar8 = sVar8 + 1;
    pcVar2 = ret->host;
    sVar9 = strlen(pcVar2);
    sVar9 = sVar9 + 1;
    __s = ret->checksum;
    if (__s == (char *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = strlen(__s);
      sVar10 = sVar10 + 1;
    }
    pcVar11 = (char *)malloc(sVar9 + sVar8 + sVar10);
    memcpy(pcVar11,pcVar1,sVar8);
    self->ctx = pcVar11;
    pcVar11 = pcVar11 + sVar8;
    memcpy(pcVar11,pcVar2,sVar9);
    self->host = pcVar11;
    if (sVar10 != 0) {
      memcpy(pcVar11 + sVar9,__s,sVar10);
      self->checksum = pcVar11 + sVar9;
    }
    self->economical = 1;
  }
  return;
}

Assistant:

static void Qiniu_Rio_BlkputRet_Assign(Qiniu_Rio_BlkputRet *self, Qiniu_Rio_BlkputRet *ret)
{
    char *p;
    size_t n1 = 0, n2 = 0, n3 = 0;

    Qiniu_Rio_BlkputRet_Cleanup(self);

    *self = *ret;
    if (ret->ctx == NULL)
    {
        return;
    }

    n1 = strlen(ret->ctx) + 1;
    n3 = strlen(ret->host) + 1;
    if (ret->checksum)
    {
        n2 = strlen(ret->checksum) + 1;
    }

    p = (char *)malloc(n1 + n2 + n3);

    memcpy(p, ret->ctx, n1);
    self->ctx = p;

    memcpy(p + n1, ret->host, n3);
    self->host = p + n1;

    if (n2)
    {
        memcpy(p + n1 + n3, ret->checksum, n2);
        self->checksum = p + n1 + n3;
    }
    self->economical = Qiniu_True;
}